

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall Rml::Element::GetFocusLeafNode(Element *this)

{
  Element *local_20;
  Element *focus_element;
  Element *this_local;
  
  this_local = this;
  if (this->focus != (Element *)0x0) {
    for (local_20 = this->focus; local_20->focus != (Element *)0x0; local_20 = local_20->focus) {
    }
    this_local = local_20;
  }
  return this_local;
}

Assistant:

Element* Element::GetFocusLeafNode()
{
	// If there isn't a focus, then we are the leaf.
	if (!focus)
	{
		return this;
	}

	// Recurse down the tree until we found the leaf focus element
	Element* focus_element = focus;
	while (focus_element->focus)
		focus_element = focus_element->focus;

	return focus_element;
}